

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt32emu-smf2wav.cpp
# Opt level: O0

void renderRaw(uint frameCount,Options *options,State *state)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint local_40;
  int local_3c;
  int sampleIx;
  int sampleSize;
  int chanMapIx_1;
  int chanMapIx;
  bool allSilent;
  uint i;
  uint renderedFramesThisPass;
  State *state_local;
  Options *options_local;
  uint frameCount_local;
  
  state->renderedFrames = (ulong)frameCount + state->renderedFrames;
  options_local._4_4_ = frameCount;
  do {
    if (options_local._4_4_ == 0) {
      return;
    }
    if (options_local._4_4_ < options->bufferFrameCount) {
      local_40 = options_local._4_4_;
    }
    else {
      local_40 = options->bufferFrameCount;
    }
    renderRaw(state->service,state->rawSampleBuffer,local_40,options->outputSampleFormat);
    for (chanMapIx = 0; (uint)chanMapIx < local_40; chanMapIx = chanMapIx + 1) {
      bVar1 = true;
      for (sampleSize = 0; sampleSize < options->rawChannelCount; sampleSize = sampleSize + 1) {
        if ((-1 < options->rawChannelMap[sampleSize]) &&
           (bVar2 = isSilence(state->rawSampleBuffer[options->rawChannelMap[sampleSize]],chanMapIx,
                              options->outputSampleFormat), !bVar2)) {
          bVar1 = false;
          break;
        }
      }
      if (bVar1) {
        state->unwrittenSilentFrames = state->unwrittenSilentFrames + 1;
      }
      else {
        flushSilence(NOISE_DETECTED,options,state);
        for (sampleIx = 0; sampleIx < options->rawChannelCount; sampleIx = sampleIx + 1) {
          if (options->rawChannelMap[sampleIx] < 0) {
            iVar3 = 2;
            if (options->outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
              iVar3 = 4;
            }
            for (local_3c = 0; local_3c < iVar3; local_3c = local_3c + 1) {
              fputc(0,(FILE *)state->outputFile);
            }
          }
          else {
            putSampleBE(state->rawSampleBuffer[options->rawChannelMap[sampleIx]],chanMapIx,
                        state->outputFile,options->outputSampleFormat);
          }
        }
        state->writtenFrames = state->writtenFrames + 1;
      }
    }
    options_local._4_4_ = options_local._4_4_ - local_40;
  } while( true );
}

Assistant:

static void renderRaw(unsigned int frameCount, const Options &options, State &state) {
	state.renderedFrames += frameCount;
	while (frameCount > 0) {
		unsigned int renderedFramesThisPass = MIN(frameCount, options.bufferFrameCount);
		renderRaw(state.service, state.rawSampleBuffer, renderedFramesThisPass, options.outputSampleFormat);
		for (unsigned int i = 0; i < renderedFramesThisPass; i++) {
			bool allSilent = true;
			for (int chanMapIx = 0; chanMapIx < options.rawChannelCount; chanMapIx++) {
				if (options.rawChannelMap[chanMapIx] >= 0 && !isSilence(state.rawSampleBuffer[options.rawChannelMap[chanMapIx]], i, options.outputSampleFormat)) {
					allSilent = false;
					break;
				}
			}
			if (allSilent) {
				state.unwrittenSilentFrames++;
				continue;
			}
			flushSilence(NOISE_DETECTED, options, state);
			for (int chanMapIx = 0; chanMapIx < options.rawChannelCount; chanMapIx++) {
				if (options.rawChannelMap[chanMapIx] < 0) {
					const int sampleSize = options.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32 ? 4 : 2;
					for (int sampleIx = 0; sampleIx < sampleSize; sampleIx++) {
						fputc(0, state.outputFile);
					}
				} else {
					putSampleBE(state.rawSampleBuffer[options.rawChannelMap[chanMapIx]], i, state.outputFile, options.outputSampleFormat);
				}
			}
			state.writtenFrames++;
		}
		frameCount -= renderedFramesThisPass;
	}
}